

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void vmaDestroyBuffer(VmaAllocator allocator,VkBuffer buffer,VmaAllocation allocation)

{
  VkAllocationCallbacks *pVVar1;
  VmaAllocation allocation_local;
  
  if (buffer != (VkBuffer)0x0 || allocation != (VmaAllocation)0x0) {
    allocation_local = allocation;
    if (buffer != (VkBuffer)0x0) {
      pVVar1 = (VkAllocationCallbacks *)0x0;
      if (allocator->m_AllocationCallbacksSpecified != false) {
        pVVar1 = &allocator->m_AllocationCallbacks;
      }
      (*(allocator->m_VulkanFunctions).vkDestroyBuffer)(allocator->m_hDevice,buffer,pVVar1);
    }
    if (allocation != (VmaAllocation)0x0) {
      VmaAllocator_T::FreeMemory(allocator,1,&allocation_local);
    }
  }
  return;
}

Assistant:

VMA_CALL_PRE void VMA_CALL_POST vmaDestroyBuffer(
    VmaAllocator allocator,
    VkBuffer buffer,
    VmaAllocation allocation)
{
    VMA_ASSERT(allocator);

    if(buffer == VK_NULL_HANDLE && allocation == VK_NULL_HANDLE)
    {
        return;
    }

    VMA_DEBUG_LOG("vmaDestroyBuffer");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    if(buffer != VK_NULL_HANDLE)
    {
        (*allocator->GetVulkanFunctions().vkDestroyBuffer)(allocator->m_hDevice, buffer, allocator->GetAllocationCallbacks());
    }

    if(allocation != VK_NULL_HANDLE)
    {
        allocator->FreeMemory(
            1, // allocationCount
            &allocation);
    }
}